

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

int Abc_NtkSubDagSize_rec(Abc_Obj_t *pObj,Vec_Int_t *vAttrs)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Vec_Int_t *vAttrs_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Vec_IntEntry(vAttrs,pObj->Id);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsCi(pObj);
      if (iVar1 == 0) {
        iVar1 = Abc_ObjFaninNum(pObj);
        if (iVar1 != 2) {
          __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCut.c"
                        ,0x291,"int Abc_NtkSubDagSize_rec(Abc_Obj_t *, Vec_Int_t *)");
        }
        pAVar3 = Abc_ObjFanin0(pObj);
        iVar1 = Abc_NtkSubDagSize_rec(pAVar3,vAttrs);
        pAVar3 = Abc_ObjFanin1(pObj);
        iVar2 = Abc_NtkSubDagSize_rec(pAVar3,vAttrs);
        pObj_local._4_4_ = iVar1 + 1 + iVar2;
      }
      else {
        pObj_local._4_4_ = 1;
      }
    }
    else {
      pObj_local._4_4_ = 0;
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkSubDagSize_rec( Abc_Obj_t * pObj, Vec_Int_t * vAttrs ) 
{
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Vec_IntEntry( vAttrs, pObj->Id ) )
        return 0;
    if ( Abc_ObjIsCi(pObj) )
        return 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    return 1 + Abc_NtkSubDagSize_rec(Abc_ObjFanin0(pObj), vAttrs) +
        Abc_NtkSubDagSize_rec(Abc_ObjFanin1(pObj), vAttrs);
}